

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client,UA_String *namespaceUri,UA_UInt16 *namespaceIndex)

{
  long lVar1;
  UA_Boolean UVar2;
  size_t i;
  long lVar3;
  UA_StatusCode UVar4;
  UA_String *s2;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined2 *local_130;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_d8 [8];
  UA_ReadResponse response;
  
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_130 = &local_128;
  local_118 = 0;
  uStack_126 = 0;
  uStack_11c = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_e8 = 0;
  uStack_110 = 0xd;
  local_128 = 0;
  uStack_124 = 0;
  uStack_120 = 0x8cf;
  local_138 = 1;
  __UA_Client_Service(client,&local_1b8,UA_TYPES + 0x87,local_d8,UA_TYPES + 0x85);
  UVar4 = response.responseHeader.timestamp._4_4_;
  if ((((response.responseHeader.timestamp._4_4_ == 0) &&
       (UVar4 = 0x80620000,
       response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1)) &&
      ((*(byte *)response.resultsSize & 1) != 0)) &&
     (UVar4 = 0x80740000, *(long *)(response.resultsSize + 8) == 0x13b5a0)) {
    lVar1 = *(long *)(response.resultsSize + 0x18);
    s2 = *(UA_String **)(response.resultsSize + 0x20);
    for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      UVar2 = UA_String_equal(namespaceUri,s2);
      if (UVar2) {
        *namespaceIndex = (UA_UInt16)lVar3;
        UVar4 = 0;
        goto LAB_00123a34;
      }
      s2 = s2 + 1;
    }
    UVar4 = 0x803e0000;
  }
LAB_00123a34:
  UA_ReadResponse_deleteMembers((UA_ReadResponse *)local_d8);
  return UVar4;
}

Assistant:

UA_StatusCode
UA_Client_NamespaceGetIndex(UA_Client *client, UA_String *namespaceUri,
                            UA_UInt16 *namespaceIndex) {
    UA_ReadRequest request;
    UA_ReadRequest_init(&request);
    UA_ReadValueId id;
    UA_ReadValueId_init(&id);
    id.attributeId = UA_ATTRIBUTEID_VALUE;
    id.nodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_SERVER_NAMESPACEARRAY);
    request.nodesToRead = &id;
    request.nodesToReadSize = 1;

    UA_ReadResponse response = UA_Client_Service_read(client, request);

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        retval = response.responseHeader.serviceResult;
    else if(response.resultsSize != 1 || !response.results[0].hasValue)
        retval = UA_STATUSCODE_BADNODEATTRIBUTESINVALID;
    else if(response.results[0].value.type != &UA_TYPES[UA_TYPES_STRING])
        retval = UA_STATUSCODE_BADTYPEMISMATCH;

    if(retval != UA_STATUSCODE_GOOD) {
        UA_ReadResponse_deleteMembers(&response);
        return retval;
    }

    retval = UA_STATUSCODE_BADNOTFOUND;
    UA_String *ns = response.results[0].value.data;
    for(size_t i = 0; i < response.results[0].value.arrayLength; ++i){
        if(UA_String_equal(namespaceUri, &ns[i])) {
            *namespaceIndex = (UA_UInt16)i;
            retval = UA_STATUSCODE_GOOD;
            break;
        }
    }

    UA_ReadResponse_deleteMembers(&response);
    return retval;
}